

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpCommsSS.cpp
# Opt level: O0

void __thiscall helics::tcp::TcpCommsSS::~TcpCommsSS(TcpCommsSS *this)

{
  TcpCommsSS *in_RDI;
  
  ~TcpCommsSS(in_RDI);
  operator_delete(in_RDI,0x500);
  return;
}

Assistant:

TcpCommsSS::~TcpCommsSS()
{
    disconnect();
}